

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_refs.c
# Opt level: O3

void refs_down(refs_table_t *tbl,uint64_t a)

{
  ulong uVar1;
  uint uVar2;
  uint32_t uVar3;
  ulong uVar4;
  ulong *puVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  bool bVar9;
  bool bVar10;
  
  uVar4 = ((a >> 0x27 | a << 0x19) ^ (a ^ 0xcbf29ce484222325) * 0x100000001b3) * 0x100000001b3;
  do {
    while (uVar2 = tbl->refs_control, 0xfffffff < uVar2) {
      do {
        iVar6 = refs_resize_help(tbl);
      } while (iVar6 != 0);
    }
    LOCK();
    bVar9 = uVar2 == tbl->refs_control;
    if (bVar9) {
      tbl->refs_control = uVar2 + 1;
    }
    UNLOCK();
  } while (!bVar9);
  iVar6 = 0x7f;
  puVar5 = tbl->refs_table + (tbl->refs_size - 1 & (uVar4 >> 0x20 ^ uVar4));
  do {
    while( true ) {
      uVar4 = *puVar5;
      bVar9 = true;
      if (uVar4 == 0) goto LAB_00114073;
      if ((uVar4 != 0x7fffffffffffffff) && ((uVar4 & 0xffffffffff) == a)) break;
      puVar5 = puVar5 + 1;
      if (puVar5 == tbl->refs_table + tbl->refs_size) {
        puVar5 = tbl->refs_table;
      }
      bVar10 = iVar6 == 0;
      iVar6 = iVar6 + -1;
      if (bVar10) goto LAB_00114073;
    }
    if (uVar4 >> 0x28 == 0x7fffff) break;
    lVar7 = (uVar4 >> 0x28) - 1;
    uVar8 = lVar7 << 0x28 | a;
    if (lVar7 == 0) {
      uVar8 = 0x7fffffffffffffff;
    }
    LOCK();
    uVar1 = *puVar5;
    if (uVar4 == uVar1) {
      *puVar5 = uVar8;
    }
    UNLOCK();
  } while (uVar4 != uVar1);
  bVar9 = false;
LAB_00114073:
  do {
    uVar3 = tbl->refs_control;
    LOCK();
    bVar10 = uVar3 == tbl->refs_control;
    if (bVar10) {
      tbl->refs_control = uVar3 - 1;
    }
    UNLOCK();
  } while (!bVar10);
  if (bVar9) {
    __assert_fail("res != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_refs.c"
                  ,0x107,"void refs_down(refs_table_t *, uint64_t)");
  }
  return;
}

Assistant:

void
refs_down(refs_table_t *tbl, uint64_t a)
{
#ifdef NDEBUG
    refs_modify(tbl, a, -1);
#else
    int res = refs_modify(tbl, a, -1);
    assert(res != 0);
#endif
}